

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O2

Box * libDAI::boundSumProd
                (Box *__return_storage_ptr__,Factor *psi,
                vector<libDAI::Box,_std::allocator<libDAI::Box>_> *incomingBoxes,VarSet *dest,
                bool independent,bool normed)

{
  long *plVar1;
  long *plVar2;
  bool bVar3;
  ulong uVar4;
  size_type __n;
  ostream *poVar5;
  size_t k_2;
  size_t l;
  ulong uVar6;
  size_type sVar7;
  undefined7 in_register_00000081;
  long lVar8;
  size_t k;
  ulong uVar9;
  long lVar10;
  vector<libDAI::Box,_std::allocator<libDAI::Box>_> uniqueBoxes;
  vector<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
  ep;
  Prob image_max;
  Prob image_min;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ep_dims;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vi;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_188;
  Box local_170;
  VarSet local_120;
  multind ep_index;
  Factor prd;
  Prob image_ep;
  TFactor<double> local_68;
  
  if ((int)CONCAT71(in_register_00000081,independent) == 0) {
    boundProd((Box *)&prd,incomingBoxes);
    if (prd._vs._statespace < 0x11) {
      boundProd(&local_170,incomingBoxes);
      TFactor<double>::TFactor(&local_68,psi);
      VarSet::VarSet(&local_120,dest);
      Box::boundSumProd(__return_storage_ptr__,&local_170,&local_68,&local_120,normed);
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_120);
      TFactor<double>::~TFactor(&local_68);
      Box::~Box(&local_170);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "# Warning: calculating looser bound in the interest of computation time"
                              );
      std::endl<char,std::char_traits<char>>(poVar5);
      Box::Box(__return_storage_ptr__,dest);
    }
    Box::~Box((Box *)&prd);
  }
  else {
    uniqueBoxes.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    uniqueBoxes.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uniqueBoxes.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::reserve
              (&uniqueBoxes,
               ((long)(incomingBoxes->super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>)
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(incomingBoxes->super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>).
                     _M_impl.super__Vector_impl_data._M_start) / 0x50);
    for (uVar6 = 0;
        uVar6 < (ulong)(((long)(incomingBoxes->
                               super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(incomingBoxes->
                              super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>)._M_impl
                              .super__Vector_impl_data._M_start) / 0x50); uVar6 = uVar6 + 1) {
      lVar8 = 0;
      uVar9 = 0;
      while( true ) {
        uVar4 = ((long)uniqueBoxes.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)uniqueBoxes.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x50;
        if (uVar4 <= uVar9) break;
        bVar3 = std::operator==((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)
                                ((incomingBoxes->
                                 super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>).
                                 _M_impl.super__Vector_impl_data._M_start + uVar6),
                                (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)
                                ((long)&((uniqueBoxes.
                                          super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_vars)._vars.
                                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar8));
        if (bVar3) {
          Box::operator*=((Box *)((long)&((uniqueBoxes.
                                           super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_vars)._vars.
                                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar8),
                          (incomingBoxes->
                          super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>)._M_impl.
                          super__Vector_impl_data._M_start + uVar6);
          uVar4 = ((long)uniqueBoxes.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)uniqueBoxes.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x50;
          break;
        }
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x50;
      }
      if (uVar4 == uVar9) {
        std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::push_back
                  (&uniqueBoxes,
                   (incomingBoxes->super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>).
                   _M_impl.super__Vector_impl_data._M_start + uVar6);
      }
    }
    __n = ((long)uniqueBoxes.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)uniqueBoxes.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x50;
    prd._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&ep_dims,__n,(value_type_conflict2 *)&prd,(allocator_type *)&local_170);
    std::
    vector<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
    ::vector(&ep,__n,(allocator_type *)&prd);
    lVar10 = 0;
    lVar8 = 0;
    for (sVar7 = 0; __n != sVar7; sVar7 = sVar7 + 1) {
      Box::extremePoints((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
                         &prd,(Box *)((long)&((uniqueBoxes.
                                               super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->_vars).
                                             _vars.
                                             super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar10));
      std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::_M_move_assign
                ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
                 ((long)&((ep.
                           super__Vector_base<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar8),&prd);
      std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::~vector
                ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)&prd);
      lVar10 = lVar10 + 0x50;
      plVar2 = (long *)((long)&((ep.
                                 super__Vector_base<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar8);
      plVar1 = (long *)((long)&((ep.
                                 super__Vector_base<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar8);
      lVar8 = lVar8 + 0x18;
      ep_dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[sVar7] = (*plVar2 - *plVar1) / 0x18;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188,&ep_dims);
    multind::multind(&ep_index,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_188);
    TProb<double>::TProb(&image_min,dest->_statespace,INFINITY);
    TProb<double>::TProb(&image_max,dest->_statespace,-INFINITY);
    for (uVar6 = 0;
        uVar6 < ep_index._pdims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1]; uVar6 = uVar6 + 1) {
      multind::vi(&vi,&ep_index,uVar6);
      TFactor<double>::TFactor(&prd);
      lVar8 = 0;
      lVar10 = 0;
      for (sVar7 = 0; __n != sVar7; sVar7 = sVar7 + 1) {
        TFactor<double>::TFactor
                  ((TFactor<double> *)&local_170,
                   (VarSet *)
                   ((long)&((uniqueBoxes.
                             super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>._M_impl.
                             super__Vector_impl_data._M_start)->_vars)._vars.
                           super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar8),
                   (TProb<double> *)
                   (vi.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar7] * 0x18 +
                   *(long *)((long)&((ep.
                                      super__Vector_base<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar10)));
        TFactor<double>::operator*=(&prd,(TFactor<double> *)&local_170);
        TFactor<double>::~TFactor((TFactor<double> *)&local_170);
        lVar10 = lVar10 + 0x18;
        lVar8 = lVar8 + 0x50;
      }
      TFactor<double>::operator*=(&prd,psi);
      TFactor<double>::marginal((TFactor<double> *)&local_170,&prd,dest,normed);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&image_ep,&local_170._min._p);
      TFactor<double>::~TFactor((TFactor<double> *)&local_170);
      min<double>((TProb<double> *)&local_170,(TProb<double> *)&image_ep,&image_min);
      TProb<double>::operator=(&image_min,(TProb<double> *)&local_170);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&local_170);
      max<double>((TProb<double> *)&local_170,(TProb<double> *)&image_ep,&image_max);
      TProb<double>::operator=(&image_max,(TProb<double> *)&local_170);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&local_170);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&image_ep);
      TFactor<double>::~TFactor(&prd);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&vi.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    }
    Box::Box(__return_storage_ptr__,dest,&image_min,&image_max);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&image_max);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&image_min);
    multind::~multind(&ep_index);
    std::
    vector<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
    ::~vector(&ep);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&ep_dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::~vector(&uniqueBoxes);
  }
  return __return_storage_ptr__;
}

Assistant:

Box boundSumProd( Factor psi, vector<Box> &incomingBoxes, VarSet dest, bool independent, bool normed ) {
        // Calculates a bounding box for the marginal or partial sum on dest
        // of the product of psi with all incoming boxes.
        //
        // If independent is true, each pair of incoming boxes hould either have
        // identical or disjoint varsets; furthermore, incoming boxes with disjoint
        // varsets are assumed to be independent.
        //
        // Otherwise, there is no restriction on the varsets of incoming boxes and
        // we assume that incoming boxes may be dependent.
        //
        // If normed is true, take the norm after taking the sum-product with psi

        if( independent ) {
            // Multiply together incoming boxes defined on the same variables
            vector<Box> uniqueBoxes;
            uniqueBoxes.reserve( incomingBoxes.size() );
            for( size_t l = 0; l < incomingBoxes.size(); l++ ) {
                size_t k = 0;
                for( k = 0; k < uniqueBoxes.size(); k++ )
                    if( incomingBoxes[l].vars() == uniqueBoxes[k].vars() ) {
                        uniqueBoxes[k] *= incomingBoxes[l];
                        break;
                    }
                if( k == uniqueBoxes.size() )
                    uniqueBoxes.push_back( incomingBoxes[l] );
            }

            // Check that all uniqueBoxes have disjoint sets of variables
            for( size_t l = 0; l < incomingBoxes.size(); l++ )
                for( size_t k = l + 1; k < incomingBoxes.size(); k++ )
                    assert( !(uniqueBoxes[k].vars() && uniqueBoxes[l].vars()) );

            size_t nrBoxes = uniqueBoxes.size();

            // Prepare multi-index to step through the Cartesian products of 
            // the extreme points corresponding to all disjoint varsets in
            // uniqueBoxes
            vector<size_t> ep_dims( nrBoxes, 0 );
            vector<vector<Prob> > ep( nrBoxes );
            for( size_t k = 0; k < nrBoxes; k++ ) {
                ep[k] = uniqueBoxes[k].extremePoints();
                ep_dims[k] = ep[k].size();
            }
            multind ep_index( ep_dims );

            // For each product of extreme points, calculate its image and
            // update the bound
            Prob image_min( dest.stateSpace(), INFINITY );
            Prob image_max( dest.stateSpace(), -INFINITY );
            for( size_t ep_li = 0; ep_li < ep_index.max(); ep_li++ ) {
                // FIXME: this can be sped up massively by caching the indices
                vector<size_t> vi = ep_index.vi( ep_li );
                Factor prd;
                for( size_t k = 0; k < nrBoxes; k++ )
                    prd *= Factor( uniqueBoxes[k].vars(), ep[k][vi[k]] );
                prd *= psi;
                Prob image_ep = prd.marginal(dest,normed).p();
                image_min = min( image_ep, image_min );
                image_max = max( image_ep, image_max );
            }
            return Box( dest, image_min, image_max );
        } else {
            Box prod = boundProd( incomingBoxes );
            if( prod.vars().stateSpace() <= 16 )
                return boundProd( incomingBoxes ).boundSumProd( psi, dest, normed );
            else {
                cout << "# Warning: calculating looser bound in the interest of computation time" << endl;
                return Box( dest );
            }
        }
    }